

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O1

char * Kit_PlaFromIsop(Vec_Str_t *vStr,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  char *pcVar5;
  int iVar6;
  byte bVar7;
  size_t sVar8;
  long local_40;
  
  if (vCover->nSize < 1) {
    __assert_fail("Vec_IntSize(vCover) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x171,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
  }
  vStr->nSize = 0;
  if (0 < vCover->nSize) {
    local_40 = 0;
    do {
      if (0 < nVars) {
        iVar1 = vCover->pArray[local_40];
        bVar7 = 0;
        iVar6 = nVars;
        do {
          switch(iVar1 >> (bVar7 & 0x1f) & 3) {
          case 0:
            uVar3 = vStr->nCap;
            cVar4 = '-';
            if (vStr->nSize == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(0x10);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,0x10);
                }
                vStr->pArray = pcVar5;
                cVar4 = '-';
LAB_005d7e7c:
                sVar8 = 0x10;
              }
              else {
                sVar8 = (ulong)uVar3 * 2;
                if ((int)sVar8 <= (int)uVar3) break;
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(sVar8);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,sVar8);
                }
                vStr->pArray = pcVar5;
                cVar4 = '-';
              }
LAB_005d7e82:
              vStr->nCap = (int)sVar8;
            }
            break;
          case 1:
            uVar3 = vStr->nCap;
            cVar4 = '0';
            if (vStr->nSize == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(0x10);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,0x10);
                }
                vStr->pArray = pcVar5;
                cVar4 = '0';
                goto LAB_005d7e7c;
              }
              sVar8 = (ulong)uVar3 * 2;
              if ((int)uVar3 < (int)sVar8) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(sVar8);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,sVar8);
                }
                vStr->pArray = pcVar5;
                cVar4 = '0';
                goto LAB_005d7e82;
              }
            }
            break;
          case 2:
            uVar3 = vStr->nCap;
            cVar4 = '1';
            if (vStr->nSize == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(0x10);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,0x10);
                }
                vStr->pArray = pcVar5;
                cVar4 = '1';
                goto LAB_005d7e7c;
              }
              sVar8 = (ulong)uVar3 * 2;
              if ((int)uVar3 < (int)sVar8) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(sVar8);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,sVar8);
                }
                vStr->pArray = pcVar5;
                cVar4 = '1';
                goto LAB_005d7e82;
              }
            }
            break;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                          ,0x181,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
          }
          iVar2 = vStr->nSize;
          vStr->nSize = iVar2 + 1;
          vStr->pArray[iVar2] = cVar4;
          bVar7 = bVar7 + 2;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar3 = vStr->nCap;
      if (vStr->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar3 * 2;
          if ((int)sVar8 <= (int)uVar3) goto LAB_005d7f3c;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar8);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar8);
          }
          vStr->pArray = pcVar5;
        }
        vStr->nCap = (int)sVar8;
      }
LAB_005d7f3c:
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      vStr->pArray[iVar1] = ' ';
      uVar3 = vStr->nCap;
      if (vStr->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar3 * 2;
          if ((int)sVar8 <= (int)uVar3) goto LAB_005d7fab;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar8);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar8);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar8;
      }
LAB_005d7fab:
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      vStr->pArray[iVar1] = '1';
      uVar3 = vStr->nCap;
      if (vStr->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar3 * 2;
          if ((int)sVar8 <= (int)uVar3) goto LAB_005d8016;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar8);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar8);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar8;
      }
LAB_005d8016:
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      vStr->pArray[iVar1] = '\n';
      local_40 = local_40 + 1;
    } while (local_40 < vCover->nSize);
  }
  uVar3 = vStr->nCap;
  if (vStr->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar5;
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar3 * 2;
      if ((int)sVar8 <= (int)uVar3) goto LAB_005d80c7;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar8);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar8);
      }
      vStr->pArray = pcVar5;
    }
    vStr->nCap = (int)sVar8;
  }
LAB_005d80c7:
  iVar1 = vStr->nSize;
  vStr->nSize = iVar1 + 1;
  vStr->pArray[iVar1] = '\0';
  return vStr->pArray;
}

Assistant:

char * Kit_PlaFromIsop( Vec_Str_t * vStr, int nVars, Vec_Int_t * vCover )
{
    int i, k, Entry, Literal;
    assert( Vec_IntSize(vCover) > 0 );
    if ( Vec_IntSize(vCover) == 0 )
        return NULL;
    Vec_StrClear( vStr );
    Vec_IntForEachEntry( vCover, Entry, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 )
                Vec_StrPush( vStr, '0' );
            else if ( Literal == 2 )
                Vec_StrPush( vStr, '1' );
            else if ( Literal == 0 )
                Vec_StrPush( vStr, '-' );
            else
                assert( 0 );
        }
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
    }
    Vec_StrPush( vStr, '\0' );
    return Vec_StrArray( vStr );
}